

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

void __thiscall
CorUnix::CPalSynchronizationManager::FreeObjectSynchData
          (CPalSynchronizationManager *this,CObjectType *potObjectType,ObjectDomain odObjectDomain,
          VOID *pvSynchData)

{
  CPalThread *pthrCurrent_00;
  CPalThread *pthrCurrent;
  CSynchData *psdSynchData;
  VOID *pvSynchData_local;
  ObjectDomain odObjectDomain_local;
  CObjectType *potObjectType_local;
  CPalSynchronizationManager *this_local;
  
  pthrCurrent_00 = InternalGetCurrentThread();
  pthrCurrent = (CPalThread *)pvSynchData;
  if ((odObjectDomain == SharedObject) &&
     (pthrCurrent = (CPalThread *)SHMPtrToPtr((SHMPTR)pvSynchData), pthrCurrent == (CPalThread *)0x0
     )) {
    fprintf(_stderr,"] %s %s:%d","FreeObjectSynchData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x455);
    fprintf(_stderr,"Bad shared memory pointer\n");
  }
  else {
    CSynchData::Release((CSynchData *)pthrCurrent,pthrCurrent_00);
  }
  return;
}

Assistant:

void CPalSynchronizationManager::FreeObjectSynchData(
        CObjectType *potObjectType,
        ObjectDomain odObjectDomain,
        VOID *pvSynchData)
    {
        CSynchData * psdSynchData;
        CPalThread * pthrCurrent = InternalGetCurrentThread();

        if (odObjectDomain == SharedObject)
        {
            psdSynchData = SharedIDToTypePointer(CSynchData,
                reinterpret_cast<SharedID>(pvSynchData));
            if (NULL == psdSynchData)
            {
                ASSERT("Bad shared memory pointer\n");
                goto FOSD_exit;
            }
        }
        else
        {
            psdSynchData = static_cast<CSynchData *>(pvSynchData);
        }

        psdSynchData->Release(pthrCurrent);

    FOSD_exit:
        return;
    }